

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SList.h
# Opt level: O0

void __thiscall
SListBase<Js::AsmJsScriptFunction*,Memory::ArenaAllocator,RealCount>::
Iterate<Js::ScriptContext::OnDebuggerAttached()::__1>
          (SListBase<Js::AsmJsScriptFunction*,Memory::ArenaAllocator,RealCount> *this)

{
  code *pcVar1;
  undefined1 this_00 [8];
  bool bVar2;
  undefined4 *puVar3;
  Type_conflict node;
  Type *ppAVar4;
  undefined1 local_38 [8];
  Iterator iter;
  SListBase<Js::AsmJsScriptFunction_*,_Memory::ArenaAllocator,_RealCount> *this_local;
  undefined1 *local_18;
  bool local_9;
  
  iter.current = (NodeBase *)this;
  SListBase<Js::AsmJsScriptFunction_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Iterator
            ((Iterator *)local_38,
             (SListBase<Js::AsmJsScriptFunction_*,_Memory::ArenaAllocator,_RealCount> *)this);
  while( true ) {
    local_18 = local_38;
    if (iter.list == (SListBase<Js::AsmJsScriptFunction_*,_Memory::ArenaAllocator,_RealCount> *)0x0)
    {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                         ,0x76,"(current != nullptr)","current != nullptr");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 0;
    }
    this_00 = local_38;
    node = SListNodeBase<Memory::ArenaAllocator>::Next
                     (&(iter.list)->super_SListNodeBase<Memory::ArenaAllocator>);
    bVar2 = SListBase<Js::AsmJsScriptFunction_*,_Memory::ArenaAllocator,_RealCount>::IsHead
                      ((SListBase<Js::AsmJsScriptFunction_*,_Memory::ArenaAllocator,_RealCount> *)
                       this_00,node);
    if (bVar2) {
      iter.list = (SListBase<Js::AsmJsScriptFunction_*,_Memory::ArenaAllocator,_RealCount> *)0x0;
    }
    else {
      iter.list = (SListBase<Js::AsmJsScriptFunction_*,_Memory::ArenaAllocator,_RealCount> *)
                  SListNodeBase<Memory::ArenaAllocator>::Next
                            (&(iter.list)->super_SListNodeBase<Memory::ArenaAllocator>);
    }
    local_9 = !bVar2;
    if (!local_9) break;
    ppAVar4 = SListBase<Js::AsmJsScriptFunction_*,_Memory::ArenaAllocator,_RealCount>::Iterator::
              Data((Iterator *)local_38);
    Js::ScriptContext::OnDebuggerAttached::anon_class_1_0_00000001::operator()
              ((anon_class_1_0_00000001 *)((long)&this_local + 7),*ppAVar4);
  }
  return;
}

Assistant:

void Iterate(Fn fn)
    {
        Iterator iter(this);
        while(iter.Next())
        {
            fn(iter.Data());
        }
    }